

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_scan.hpp
# Opt level: O2

int * Omega_h::inclusive_scan<Omega_h::CastIterator<int,int>,int*>
                (CastIterator<int,_int> first,CastIterator<int,_int> last,int *result)

{
  long lVar1;
  int iVar2;
  d_t i;
  long lVar3;
  
  lVar1 = (long)last.ptr - (long)first.ptr >> 2;
  if (0 < lVar1) {
    iVar2 = *first.ptr;
    *result = iVar2;
    for (lVar3 = 1; lVar1 != lVar3; lVar3 = lVar3 + 1) {
      iVar2 = iVar2 + first.ptr[lVar3];
      result[lVar3] = iVar2;
    }
    result = (int *)((long)result + ((long)last.ptr - (long)first.ptr));
  }
  return result;
}

Assistant:

OutputIterator inclusive_scan(
    InputIterator first, InputIterator last, OutputIterator result) {
  auto const n = last - first;
  if (n <= 0) return result;
  auto value = first[0];
  result[0] = value;
  using d_t = typename std::remove_const<decltype(n)>::type;
  for (d_t i = 1; i < n; ++i) {
    value = std::move(value) + first[i];
    result[i] = value;
  }
  return result + n;
}